

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O0

uint64_t pauth_addpac(CPUARMState_conflict *env,uint64_t ptr,uint64_t modifier,ARMPACKey *key,
                     _Bool data)

{
  byte bVar1;
  ARMMMUIdx mmu_idx_00;
  ARMVAParameters AVar2;
  int iVar3;
  int start;
  uint64_t data_00;
  int64_t iVar4;
  ulong uVar5;
  ulong uVar6;
  int top_bit;
  int bot_bit;
  uint64_t test;
  uint64_t ext;
  uint64_t ext_ptr;
  uint64_t pac;
  ARMVAParameters param;
  ARMMMUIdx mmu_idx;
  _Bool data_local;
  ARMPACKey *key_local;
  uint64_t modifier_local;
  uint64_t ptr_local;
  CPUARMState_conflict *env_local;
  
  mmu_idx_00 = arm_stage1_mmu_idx_aarch64(env);
  AVar2 = aa64_va_parameters_aarch64(env,ptr,mmu_idx_00,data);
  pac._4_2_ = AVar2._0_2_;
  if ((pac._4_2_ >> 9 & 1) == 0) {
    test = sextract64(ptr,0x3f,1);
  }
  else {
    test = sextract64(ptr,0x37,1);
  }
  iVar3 = (uint)(AVar2._1_1_ >> 1 & 1) * -8 + 0x40;
  start = 0x40 - (uint)(pac._4_2_ & 0xff);
  data_00 = deposit64(ptr,start,iVar3 - start,test);
  ext_ptr = pauth_computepac(data_00,modifier,*key);
  iVar4 = sextract64(ptr,start,iVar3 - start);
  if ((iVar4 != 0) && (iVar4 != -1)) {
    ext_ptr = 1L << ((char)iVar3 - 1U & 0x3f) ^ ext_ptr;
  }
  bVar1 = (byte)start;
  if ((pac._4_2_ >> 9 & 1) == 0) {
    uVar5 = 0xffffffffffffffff >> (0x40 - bVar1 & 0x3f);
    uVar6 = (0xffffffffffffffffU >> (0x40 - bVar1 & 0x3f) | 0x80000000000000) ^ 0xffffffffffffffff;
  }
  else {
    uVar5 = (0xffffffffffffffffU >> (0x40 - ('8' - bVar1) & 0x3f)) << (bVar1 & 0x3f) ^
            0xffffffffffffffff;
    uVar6 = (0xffffffffffffffffU >> (0x40 - ('7' - bVar1) & 0x3f)) << (bVar1 & 0x3f);
  }
  modifier_local = uVar5 & ptr;
  ext_ptr = uVar6 & ext_ptr;
  return ext_ptr | test & 0x80000000000000 | modifier_local;
}

Assistant:

static uint64_t pauth_addpac(CPUARMState *env, uint64_t ptr, uint64_t modifier,
                             ARMPACKey *key, bool data)
{
    ARMMMUIdx mmu_idx = arm_stage1_mmu_idx(env);
    ARMVAParameters param = aa64_va_parameters(env, ptr, mmu_idx, data);
    uint64_t pac, ext_ptr, ext, test;
    int bot_bit, top_bit;

    /* If tagged pointers are in use, use ptr<55>, otherwise ptr<63>.  */
    if (param.tbi) {
        ext = sextract64(ptr, 55, 1);
    } else {
        ext = sextract64(ptr, 63, 1);
    }

    /* Build a pointer with known good extension bits.  */
    top_bit = 64 - 8 * param.tbi;
    bot_bit = 64 - param.tsz;
    ext_ptr = deposit64(ptr, bot_bit, top_bit - bot_bit, ext);

    pac = pauth_computepac(ext_ptr, modifier, *key);

    /*
     * Check if the ptr has good extension bits and corrupt the
     * pointer authentication code if not.
     */
    test = sextract64(ptr, bot_bit, top_bit - bot_bit);
    if (test != 0 && test != -1) {
        pac ^= MAKE_64BIT_MASK(top_bit - 1, 1);
    }

    /*
     * Preserve the determination between upper and lower at bit 55,
     * and insert pointer authentication code.
     */
    if (param.tbi) {
        ptr &= ~MAKE_64BIT_MASK(bot_bit, 55 - bot_bit + 1);
        pac &= MAKE_64BIT_MASK(bot_bit, 54 - bot_bit + 1);
    } else {
        ptr &= MAKE_64BIT_MASK(0, bot_bit);
        pac &= ~(MAKE_64BIT_MASK(55, 1) | MAKE_64BIT_MASK(0, bot_bit));
    }
    ext &= MAKE_64BIT_MASK(55, 1);
    return pac | ext | ptr;
}